

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

JsValueRef
Debugger::SetBreakOnException
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  JsRuntimeHandle runtimeHandle;
  JsErrorCode jsErrorCode_2;
  JsErrorCode jsErrorCode_1;
  JsErrorCode jsErrorCode;
  JsValueRef breakOnException;
  void *pvStack_38;
  int exceptionAttributes;
  void *callbackState_local;
  JsValueRef *ppvStack_28;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_18;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  if (1 < argumentCount) {
    pvStack_38 = callbackState;
    callbackState_local._6_2_ = argumentCount;
    ppvStack_28 = arguments;
    arguments_local._7_1_ = isConstructCall;
    pvStack_18 = callee;
    JVar1 = ChakraRTInterface::JsConvertValueToNumber(arguments[1],(JsValueRef *)&jsErrorCode_1);
    if (JVar1 == JsNoError) {
      JVar1 = ChakraRTInterface::JsNumberToInt(_jsErrorCode_1,(int *)((long)&breakOnException + 4));
      if (JVar1 == JsNoError) {
        runtimeHandle = GetRuntime();
        JVar1 = ChakraRTInterface::JsDiagSetBreakOnException(runtimeHandle,breakOnException._4_4_);
        if (JVar1 != JsNoError) {
          pPVar2 = PAL_get_stderr(0);
          pWVar3 = Helpers::JsErrorCodeToString(JVar1);
          PAL_fwprintf(pPVar2,
                       L"ERROR: ChakraRTInterface::JsDiagSetBreakOnException(Debugger::GetRuntime(), (JsDiagBreakOnExceptionAttributes)exceptionAttributes) failed. JsErrorCode=0x%x (%s)\n"
                       ,(ulong)JVar1,pWVar3);
          pPVar2 = PAL_get_stderr(0);
          PAL_fflush(pPVar2);
        }
      }
      else {
        pPVar2 = PAL_get_stderr(0);
        pWVar3 = Helpers::JsErrorCodeToString(JVar1);
        PAL_fwprintf(pPVar2,
                     L"ERROR: ChakraRTInterface::JsNumberToInt(breakOnException, &exceptionAttributes) failed. JsErrorCode=0x%x (%s)\n"
                     ,(ulong)JVar1,pWVar3);
        pPVar2 = PAL_get_stderr(0);
        PAL_fflush(pPVar2);
      }
    }
    else {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar2,
                   L"ERROR: ChakraRTInterface::JsConvertValueToNumber(arguments[1], &breakOnException) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
    }
  }
  return (JsValueRef)0x0;
}

Assistant:

JsValueRef Debugger::SetBreakOnException(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    int exceptionAttributes;

    if (argumentCount > 1)
    {
        JsValueRef breakOnException;
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsConvertValueToNumber(arguments[1], &breakOnException));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(breakOnException, &exceptionAttributes));

        IfJsErrorFailLogAndRet(ChakraRTInterface::JsDiagSetBreakOnException(Debugger::GetRuntime(), (JsDiagBreakOnExceptionAttributes)exceptionAttributes));
    }

    return JS_INVALID_REFERENCE;
}